

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void merge_lcp_2way_unstable<false>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  int iVar1;
  lcp_t *plVar2;
  size_t sVar3;
  lcp_t *plVar4;
  size_t sVar5;
  uchar **ppuVar6;
  tuple<int&,unsigned_long&> local_a8 [16];
  tuple<int,_unsigned_long> local_98;
  lcp_t local_88;
  lcp_t lcp01_1;
  tuple<int&,unsigned_long&> local_78 [4];
  int cmp01_1;
  tuple<int,_unsigned_long> local_68;
  lcp_t local_58;
  lcp_t lcp01;
  lcp_t lStack_48;
  int cmp01;
  lcp_t lcp1;
  lcp_t lcp0;
  size_t n1_local;
  lcp_t *lcp_input1_local;
  uchar **from1_local;
  size_t n0_local;
  lcp_t *lcp_input0_local;
  uchar **from0_local;
  
  lcp0 = n1;
  n1_local = (size_t)lcp_input1;
  lcp_input1_local = (lcp_t *)from1;
  from1_local = (uchar **)n0;
  n0_local = (size_t)lcp_input0;
  lcp_input0_local = (lcp_t *)from0;
  check_input(from0,lcp_input0,n0);
  check_input((uchar **)lcp_input1_local,(lcp_t *)n1_local,lcp0);
  lcp1 = 0;
  lStack_48 = 0;
  compare((uchar *)&local_68,(uchar *)*lcp_input0_local,*lcp_input1_local);
  std::tie<int,unsigned_long>((int *)local_78,(unsigned_long *)((long)&lcp01 + 4));
  std::tuple<int&,unsigned_long&>::operator=(local_78,&local_68);
  if (lcp01._4_4_ < 1) {
    plVar2 = lcp_input0_local + 1;
    *result = (uchar *)*lcp_input0_local;
    sVar3 = n0_local + 8;
    lcp1 = *(lcp_t *)n0_local;
    lStack_48 = local_58;
    from1_local = (uchar **)((long)from1_local + -1);
    ppuVar6 = result + 1;
    n0_local = sVar3;
    lcp_input0_local = plVar2;
    if (from1_local == (uchar **)0x0) goto LAB_0027de01;
  }
  else {
    plVar2 = lcp_input1_local + 1;
    *result = (uchar *)*lcp_input1_local;
    sVar3 = n1_local + 8;
    lStack_48 = *(lcp_t *)n1_local;
    lcp1 = local_58;
    lcp0 = lcp0 - 1;
    ppuVar6 = result + 1;
    n1_local = sVar3;
    lcp_input1_local = plVar2;
    if (lcp0 == 0) {
LAB_0027de57:
      result = ppuVar6;
      lcp0 = 0;
      if (from1_local != (uchar **)0x0) {
        std::copy<unsigned_char**,unsigned_char**>
                  ((uchar **)lcp_input0_local,(uchar **)(lcp_input0_local + (long)from1_local),
                   result);
      }
      return;
    }
  }
  result = result + 1;
LAB_0027da64:
  do {
    check_lcps(result[-1],(uchar *)*lcp_input0_local,lcp1,(uchar *)*lcp_input1_local,lStack_48);
    if (lcp1 <= lStack_48) {
      if (lcp1 < lStack_48) {
        iVar1 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
        if (iVar1 < 1) {
          __assert_fail("cmp(*from0, *from1) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x655,
                        "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                       );
        }
        ppuVar6 = result + 1;
        *result = (uchar *)*lcp_input1_local;
        lStack_48 = *(lcp_t *)n1_local;
        lcp0 = lcp0 - 1;
        lcp_input1_local = lcp_input1_local + 1;
        n1_local = n1_local + 8;
      }
      else {
        compare((uchar *)&local_98,(uchar *)*lcp_input0_local,*lcp_input1_local);
        std::tie<int,unsigned_long>((int *)local_a8,(unsigned_long *)((long)&lcp01_1 + 4));
        std::tuple<int&,unsigned_long&>::operator=(local_a8,&local_98);
        if (lcp01_1._4_4_ < 0) {
          plVar2 = lcp_input0_local + 1;
          *result = (uchar *)*lcp_input0_local;
          lStack_48 = local_88;
          from1_local = (uchar **)((long)from1_local + -1);
          ppuVar6 = result + 1;
          lcp_input0_local = plVar2;
          if (from1_local == (uchar **)0x0) break;
          lcp1 = *(lcp_t *)n0_local;
          result = result + 1;
          n0_local = n0_local + 8;
          goto LAB_0027da64;
        }
        if (lcp01_1._4_4_ != 0) {
          plVar2 = lcp_input1_local + 1;
          *result = (uchar *)*lcp_input1_local;
          lcp1 = local_88;
          lcp0 = lcp0 - 1;
          ppuVar6 = result + 1;
          lcp_input1_local = plVar2;
          if (lcp0 == 0) goto LAB_0027de57;
          lStack_48 = *(lcp_t *)n1_local;
          result = result + 1;
          n1_local = n1_local + 8;
          goto LAB_0027da64;
        }
        iVar1 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
        if (iVar1 != 0) {
          __assert_fail("cmp(*from0, *from1)==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x664,
                        "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                       );
        }
        if (from1_local == (uchar **)0x0) {
          __assert_fail("n0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x665,
                        "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                       );
        }
        if (lcp0 == 0) {
          __assert_fail("n1",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x665,
                        "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                       );
        }
        plVar2 = lcp_input0_local + 1;
        *result = (uchar *)*lcp_input0_local;
        plVar4 = lcp_input1_local + 1;
        ppuVar6 = result + 2;
        result[1] = (uchar *)*lcp_input1_local;
        from1_local = (uchar **)((long)from1_local + -1);
        lcp0 = lcp0 - 1;
        sVar3 = n0_local + 8;
        lcp1 = *(lcp_t *)n0_local;
        sVar5 = n1_local + 8;
        lStack_48 = *(lcp_t *)n1_local;
        n1_local = sVar5;
        lcp_input1_local = plVar4;
        n0_local = sVar3;
        lcp_input0_local = plVar2;
        if (from1_local == (uchar **)0x0) break;
      }
      result = ppuVar6;
      if (lcp0 == 0) goto LAB_0027de57;
      goto LAB_0027da64;
    }
    iVar1 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
    if (-1 < iVar1) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x64f,
                    "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                   );
    }
    plVar2 = lcp_input0_local + 1;
    *result = (uchar *)*lcp_input0_local;
    sVar3 = n0_local + 8;
    lcp1 = *(lcp_t *)n0_local;
    from1_local = (uchar **)((long)from1_local + -1);
    ppuVar6 = result + 1;
    result = result + 1;
    n0_local = sVar3;
    lcp_input0_local = plVar2;
  } while (from1_local != (uchar **)0x0);
LAB_0027de01:
  result = ppuVar6;
  from1_local = (uchar **)0x0;
  if (lcp0 == 0) {
    return;
  }
  std::copy<unsigned_char**,unsigned_char**>
            ((uchar **)lcp_input1_local,(uchar **)(lcp_input1_local + lcp0),result);
  return;
}

Assistant:

static void
merge_lcp_2way_unstable(
               unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	check_input(from0, lcp_input0, n0);
	check_input(from1, lcp_input1, n1);
	lcp_t lcp0=0, lcp1=0;
	int cmp01; lcp_t lcp01;
	std::tie(cmp01, lcp01) = compare(*from0, *from1);
	if (cmp01 <= 0) {
		*result++ = *from0++;
		lcp0 = *lcp_input0++;
		lcp1 = lcp01;
		if (--n0 == 0) goto finish0;
	} else {
		*result++ = *from1++;
		lcp1 = *lcp_input1++;
		lcp0 = lcp01;
		if (--n1 == 0) goto finish1;
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '" <<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		check_lcps(*(result-1),*from0,lcp0,*from1,lcp1);
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (cmp01 < 0) {
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else if (cmp01 == 0) {
				assert(cmp(*from0, *from1)==0);
				assert(n0); assert(n1);
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *lcp_result++ = lcp01;
				*result++ = *from0++;
				*result++ = *from1++;
				--n0;
				--n1;
				lcp0 = *lcp_input0++;
				lcp1 = *lcp_input1++;
				if (n0 == 0) goto finish0;
				if (n1 == 0) goto finish1;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	if (n1) {
		std::copy(from1, from1+n1, result);
		if (OutputLCP) *lcp_result++ = lcp1;
		if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	}
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	if (n0) {
		std::copy(from0, from0+n0, result);
		if (OutputLCP) *lcp_result++ = lcp0;
		if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	}
	return;
}